

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilFile.c
# Opt level: O2

int Extra_ReadHexadecimal(uint *Sign,char *pString,int nVars)

{
  byte bVar1;
  int nDigits;
  ulong uVar2;
  ulong uVar3;
  
  bVar1 = (byte)nVars - 5 & 0x1f;
  uVar3 = 0;
  uVar2 = (ulong)(uint)(1 << bVar1);
  if (1 << bVar1 < 1) {
    uVar2 = uVar3;
  }
  if (nVars < 6) {
    uVar2 = 1;
  }
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    Sign[uVar3] = 0;
  }
  nDigits = (1 << ((byte)nVars & 0x1f)) / 4;
  if ((uint)nVars < 2) {
    nDigits = 1;
  }
  Extra_ReadHex(Sign,pString,nDigits);
  return 1;
}

Assistant:

int Extra_ReadHexadecimal( unsigned Sign[], char * pString, int nVars )
{
    int nWords, nDigits, k;
    nWords = Extra_TruthWordNum( nVars );
    for ( k = 0; k < nWords; k++ )
        Sign[k] = 0;
    // read the number from the string
    nDigits = (1 << nVars) / 4;
    if ( nDigits == 0 )
        nDigits = 1;
    Extra_ReadHex( Sign, pString, nDigits );
    return 1;
}